

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active_interactor.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  ssize_t sVar3;
  ostream *poVar4;
  runtime_error *prVar5;
  istream *piVar6;
  char *pcVar7;
  long in_RSI;
  int in_EDI;
  char *msg_4;
  char *msg_3;
  string imp;
  char *msg_2;
  char *msg_1;
  char *sp;
  char *cstr;
  int len;
  char *msg;
  size_t id;
  string line;
  int queries;
  int ret;
  int s;
  ssize_t pos;
  unsigned_short port;
  char *host;
  string tag;
  char *ttag;
  char *itok;
  char *toks;
  char buf [256];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc88;
  undefined8 in_stack_fffffffffffffc90;
  allocator local_289;
  string local_288 [32];
  string local_268 [32];
  string local_248 [32];
  string local_228 [36];
  byte local_204;
  allocator local_203;
  byte local_202;
  allocator local_201;
  string local_200 [32];
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  int local_1bc;
  char *local_1b8;
  undefined8 local_1b0 [3];
  string local_198 [36];
  int local_174;
  int local_170;
  int local_16c;
  ulong local_168;
  ushort local_15a;
  char *local_158;
  string local_150 [32];
  char *local_130;
  char *local_128;
  char *local_120;
  char local_118 [264];
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  std::__cxx11::string::string(local_150);
  local_158 = "localhost";
  local_15a = 0xffff;
  local_174 = 0;
  std::__cxx11::string::string(local_198);
  if (1 < local_8) {
    local_158 = *(char **)(local_10 + 8);
  }
  if (2 < local_8) {
    iVar2 = atoi(*(char **)(local_10 + 0x10));
    local_15a = (ushort)iVar2;
  }
  if ((local_15a < 0x401) || (local_15a == 0xffff)) {
    local_15a = 0x67ae;
  }
  local_16c = open_socket((char *)buf._32_8_,buf._30_2_);
  local_1b0[0] = 0;
  sVar3 = send(local_16c,local_1b0,8,0);
  local_170 = (int)sVar3;
  if (local_170 < 0) {
    local_1b8 = "Could not perform handshake!";
    poVar4 = std::operator<<((ostream *)&std::cerr,"Could not perform handshake!");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,local_1b8);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  while( true ) {
    do {
      piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&std::cin,local_198);
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar6 + *(long *)(*(long *)piVar6 + -0x18)));
      if (!bVar1) {
        close(local_16c);
        poVar4 = std::operator<<((ostream *)&std::cout,"Went through the data by doing ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_174);
        poVar4 = std::operator<<(poVar4," queries");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        local_4 = 0;
        std::__cxx11::string::~string(local_198);
        std::__cxx11::string::~string(local_150);
        return local_4;
      }
      std::__cxx11::string::append((char *)local_198);
      local_1bc = std::__cxx11::string::size();
      local_1c8 = (char *)std::__cxx11::string::c_str();
      local_1d0 = strchr(local_1c8,0x20);
      sVar3 = send(local_16c,local_1d0 + 1,
                   (size_t)(local_1c8 + ((long)local_1bc - (long)(local_1d0 + 1))),0);
      local_170 = (int)sVar3;
      if (local_170 < 0) {
        local_1d8 = "Could not send unlabeled data!";
        poVar4 = std::operator<<((ostream *)&std::cerr,"Could not send unlabeled data!");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,local_1d8);
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_170 = recvall((int)((ulong)in_stack_fffffffffffffc90 >> 0x20),
                          (char *)in_stack_fffffffffffffc88,
                          (int)((ulong)in_stack_fffffffffffffc80 >> 0x20));
      if (local_170 < 0) {
        local_1e0 = "Could not receive queries!";
        poVar4 = std::operator<<((ostream *)&std::cerr,"Could not receive queries!");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,local_1e0);
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_118[local_170] = '\0';
      local_120 = local_118;
      strsep(&local_120," ");
      pcVar7 = strsep(&local_120," ");
      local_202 = 0;
      local_204 = 0;
      local_130 = pcVar7;
      if (pcVar7 == (char *)0x0) {
        std::allocator<char>::allocator();
        local_204 = 1;
        std::__cxx11::string::string(local_200,"\'empty",&local_203);
      }
      else {
        std::allocator<char>::allocator();
        local_202 = 1;
        std::__cxx11::string::string(local_200,pcVar7,&local_201);
      }
      std::__cxx11::string::operator=(local_150,local_200);
      std::__cxx11::string::~string(local_200);
      if ((local_204 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_203);
      }
      if ((local_202 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_201);
      }
      pcVar7 = strsep(&local_120,"\n");
      local_128 = pcVar7;
    } while ((pcVar7 == (char *)0x0) || (*pcVar7 == '\0'));
    local_174 = local_174 + 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_288,pcVar7,&local_289);
    std::operator+(in_stack_fffffffffffffc88,(char *)in_stack_fffffffffffffc80);
    std::operator+(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
    std::operator+(in_stack_fffffffffffffc88,(char *)in_stack_fffffffffffffc80);
    std::__cxx11::string::~string(local_248);
    std::__cxx11::string::~string(local_268);
    std::__cxx11::string::~string(local_288);
    std::allocator<char>::~allocator((allocator<char> *)&local_289);
    local_168 = std::__cxx11::string::find_first_of((char *)local_198,0x104094);
    std::__cxx11::string::replace((ulong)local_198,local_168,(string *)0x1);
    local_1c8 = (char *)std::__cxx11::string::c_str();
    local_1bc = std::__cxx11::string::size();
    sVar3 = send(local_16c,local_1c8,(long)local_1bc,0);
    local_170 = (int)sVar3;
    if (local_170 < 0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Could not send labeled data!");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"Could not send labeled data!");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_170 = recvall((int)((ulong)in_stack_fffffffffffffc90 >> 0x20),
                        (char *)in_stack_fffffffffffffc88,
                        (int)((ulong)in_stack_fffffffffffffc80 >> 0x20));
    if (local_170 < 0) break;
    std::__cxx11::string::~string(local_228);
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"Could not receive predictions!");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar5,"Could not receive predictions!");
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main(int argc, char* argv[])
{
  char buf[256];
  char *toks, *itok, *ttag;
  string tag;
  const char* host = "localhost";
  unsigned short port = ~0;
  ssize_t pos;
  int s, ret, queries = 0;
  string line;

  if (argc > 1)
  {
    host = argv[1];
  }
  if (argc > 2)
  {
    port = atoi(argv[2]);
  }
  if (port <= 1024 || port == (unsigned short)(~0))
  {
    port = 26542;
  }

  s = open_socket(host, port);
  size_t id = 0;
  ret = send(s, &id, sizeof(id), 0);
  if (ret < 0)
  {
    const char* msg = "Could not perform handshake!";
    cerr << msg << endl;
    throw runtime_error(msg);
  }

  while (getline(cin, line))
  {
    line.append("\n");
    int len = line.size();
    const char* cstr = line.c_str();
    const char* sp = strchr(cstr, ' ');
    ret = send(s, sp + 1, len - (sp + 1 - cstr), 0);
    if (ret < 0)
    {
      const char* msg = "Could not send unlabeled data!";
      cerr << msg << endl;
      throw runtime_error(msg);
    }
    ret = recvall(s, buf, 256);
    if (ret < 0)
    {
      const char* msg = "Could not receive queries!";
      cerr << msg << endl;
      throw runtime_error(msg);
    }
    buf[ret] = '\0';
    toks = &buf[0];
    strsep(&toks, " ");
    ttag = strsep(&toks, " ");
    tag = ttag ? string(ttag) : string("'empty");
    itok = strsep(&toks, "\n");
    if (itok == nullptr || itok[0] == '\0')
    {
      continue;
    }

    queries += 1;
    string imp = string(itok) + " " + tag + " |";
    pos = line.find_first_of("|");
    line.replace(pos, 1, imp);
    cstr = line.c_str();
    len = line.size();
    ret = send(s, cstr, len, 0);
    if (ret < 0)
    {
      const char* msg = "Could not send labeled data!";
      cerr << msg << endl;
      throw runtime_error(msg);
    }
    ret = recvall(s, buf, 256);
    if (ret < 0)
    {
      const char* msg = "Could not receive predictions!";
      cerr << msg << endl;
      throw runtime_error(msg);
    }
  }
  close(s);
  cout << "Went through the data by doing " << queries << " queries" << endl;
  return 0;
}